

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m2v_mul(m2v *A,m2v *B,m2v *AB_out)

{
  int iVar1;
  int iVar2;
  int c;
  int i;
  int r;
  int j;
  int c_00;
  uint val;
  int iVar3;
  
  for (r = 0; r < AB_out->n_row; r = r + 1) {
    for (c_00 = 0; c_00 < AB_out->n_col; c_00 = c_00 + 1) {
      val = 0;
      iVar3 = A->n_col;
      if (A->n_col < 1) {
        iVar3 = 0;
      }
      for (c = 0; iVar3 != c; c = c + 1) {
        iVar1 = m2v_get_el(A,r,c);
        iVar2 = m2v_get_el(B,c,c_00);
        val = val ^ iVar2 * iVar1;
      }
      m2v_set_el(AB_out,r,c_00,val);
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_mul)(const MV_GEN_TYPE* A, const MV_GEN_TYPE* B, MV_GEN_TYPE* AB_out)
{
	assert(A->n_col == B->n_row);
	assert(A->n_row == AB_out->n_row);
	assert(B->n_col == AB_out->n_col);

	for (int i = 0; i < AB_out->n_row; ++i) {
		for (int j = 0; j < AB_out->n_col; ++j) {
			MV_GEN_ELTYPE x = 0;
			for (int e = 0; e < A->n_col; ++e) {
				const MV_GEN_ELTYPE a = MV_GEN_N(_get_el)(A, i, e);
				const MV_GEN_ELTYPE b = MV_GEN_N(_get_el)(B, e, j);
				x = fadd(x, fmul(a, b));
			}
			MV_GEN_N(_set_el)(AB_out, i, j, x);
		}
	}
}